

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

void __thiscall
spvtools::opt::IRContext::CollectNonSemanticTree
          (IRContext *this,Instruction *inst,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *to_kill)

{
  Instruction *def;
  DefUseManager *this_00;
  bool bVar1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> work_list;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  seen;
  void *local_a8;
  void *pvStack_a0;
  long local_98;
  Instruction *local_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  if ((inst->has_result_id_ == true) &&
     (local_90 = inst, bVar1 = Instruction::IsDebugLineInst(inst), !bVar1)) {
    local_a8 = (void *)0x0;
    pvStack_a0 = (void *)0x0;
    local_98 = 0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
    _M_realloc_insert<spvtools::opt::Instruction*const&>
              ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
               &local_a8,(iterator)0x0,&local_90);
    if (local_a8 != pvStack_a0) {
      do {
        def = *(Instruction **)((long)pvStack_a0 + -8);
        pvStack_a0 = (void *)((long)pvStack_a0 + -8);
        if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          BuildDefUseManager(this);
        }
        this_00 = (this->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        local_78 = (code *)0x0;
        pcStack_70 = (code *)0x0;
        local_88._M_unused._M_object = (void *)0x0;
        local_88._8_8_ = 0;
        local_88._M_unused._M_object = operator_new(0x18);
        *(void ***)local_88._M_unused._0_8_ = &local_a8;
        *(unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          **)((long)local_88._M_unused._0_8_ + 8) = to_kill;
        *(_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          **)((long)local_88._M_unused._0_8_ + 0x10) = &local_68;
        pcStack_70 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:263:12)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:263:12)>
                   ::_M_manager;
        analysis::DefUseManager::ForEachUser
                  (this_00,def,(function<void_(spvtools::opt::Instruction_*)> *)&local_88);
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
        }
      } while (local_a8 != pvStack_a0);
    }
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
    if (local_a8 != (void *)0x0) {
      operator_delete(local_a8,local_98 - (long)local_a8);
    }
  }
  return;
}

Assistant:

void IRContext::CollectNonSemanticTree(
    Instruction* inst, std::unordered_set<Instruction*>* to_kill) {
  if (!inst->HasResultId()) return;
  // Debug[No]Line result id is not used, so we are done
  if (inst->IsDebugLineInst()) return;
  std::vector<Instruction*> work_list;
  std::unordered_set<Instruction*> seen;
  work_list.push_back(inst);

  while (!work_list.empty()) {
    auto* i = work_list.back();
    work_list.pop_back();
    get_def_use_mgr()->ForEachUser(
        i, [&work_list, to_kill, &seen](Instruction* user) {
          if (user->IsNonSemanticInstruction() && seen.insert(user).second) {
            work_list.push_back(user);
            to_kill->insert(user);
          }
        });
  }
}